

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O2

JL_STATUS UnmarshalObject(JlDataObject *Object,JlMarshallElement *Description,
                         _Bool IgnoreExistingValuesInStruct,void *Output,size_t *pErrorAtPos)

{
  JL_NUM_TYPE JVar1;
  ulong __n;
  JL_STATUS JVar2;
  JL_DATA_TYPE JVar3;
  char *in_RAX;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  uint8_t *OutputU8;
  char *stringPtr;
  
  JVar3 = Description->Type;
  JVar2 = JL_STATUS_INVALID_TYPE;
  stringPtr = in_RAX;
  switch(JVar3) {
  case JL_DATA_TYPE_STRING:
    __n = Description->FieldSize;
    if (__n == 0) {
      stringPtr = (char *)0x0;
      if ((!IgnoreExistingValuesInStruct) && (*Output != (void *)0x0)) {
        WjTestLib_Free(*Output);
        *(undefined8 *)Output = 0;
      }
      JVar2 = JlGetObjectString(Object,&stringPtr);
      if ((JVar2 == JL_STATUS_SUCCESS) && (JVar2 = JL_STATUS_SUCCESS, stringPtr != (char *)0x0)) {
        pcVar5 = JlStrDup(stringPtr);
        if (pcVar5 == (char *)0x0) {
          JVar2 = JL_STATUS_OUT_OF_MEMORY;
        }
        else {
          *(char **)Output = pcVar5;
        }
      }
    }
    else {
      stringPtr = (char *)0x0;
      memset(Output,0,__n);
      JVar2 = JlGetObjectString(Object,&stringPtr);
      pcVar5 = stringPtr;
      if (JVar2 == JL_STATUS_SUCCESS) {
        if (stringPtr == (char *)0x0) {
          JVar2 = JL_STATUS_SUCCESS;
          memset(Output,0,__n);
        }
        else if (Output == (void *)0x0) {
          JVar2 = JL_STATUS_INVALID_PARAMETER;
        }
        else {
          sVar4 = strlen(stringPtr);
          if (sVar4 < __n) {
            strcpy((char *)Output,pcVar5);
            goto LAB_00104c72;
          }
          JVar2 = JL_STATUS_BUFFER_TOO_SMALL;
        }
      }
    }
    break;
  case JL_DATA_TYPE_NUMBER:
    JVar1 = Description->NumberType;
    if (JVar1 == JL_NUM_TYPE_FLOAT) {
      sVar6 = Description->FieldSize;
      stringPtr = (char *)0x0;
      JVar2 = JlGetObjectNumberF64(Object,(double *)&stringPtr);
      if (JVar2 == JL_STATUS_SUCCESS) {
        if (sVar6 == 4) {
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if (((double)stringPtr <= 3.4028234663852886e+38) &&
             (1.1754943508222875e-38 <= (double)stringPtr)) {
            *(float *)Output = (float)(double)stringPtr;
            goto LAB_00104c72;
          }
        }
        else {
          if (sVar6 == 8) {
            *(char **)Output = stringPtr;
            goto LAB_00104c72;
          }
          JVar2 = JL_STATUS_INVALID_SPECIFICATION;
        }
      }
    }
    else if (JVar1 == JL_NUM_TYPE_SIGNED) {
      sVar6 = Description->FieldSize;
      stringPtr = (char *)0x0;
      JVar2 = JlGetObjectNumberS64(Object,(int64_t *)&stringPtr);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JL_STATUS_INVALID_SPECIFICATION;
        switch(sVar6) {
        case 1:
          if ((char *)(long)(char)stringPtr != stringPtr) goto LAB_00104ced;
LAB_00104be2:
          *(char *)Output = (char)stringPtr;
          break;
        case 2:
          if ((char *)(long)(short)stringPtr != stringPtr) goto LAB_00104ced;
LAB_00104cd3:
          *(short *)Output = (short)stringPtr;
          break;
        default:
          goto switchD_00104a9b_caseD_3;
        case 4:
          if ((char *)(long)(int)stringPtr != stringPtr) goto LAB_00104ced;
LAB_00104ce7:
          *(int *)Output = (int)stringPtr;
          break;
        case 8:
switchD_00104b03_caseD_8:
          pcVar5 = stringPtr;
          goto LAB_00104c6e;
        }
        goto LAB_00104c72;
      }
    }
    else {
      if (JVar1 != JL_NUM_TYPE_UNSIGNED) {
        JVar3 = JL_DATA_TYPE_NUMBER;
        goto switchD_001049f1_caseD_4;
      }
      sVar6 = Description->FieldSize;
      stringPtr = (char *)0x0;
      JVar2 = JlGetObjectNumberU64(Object,(uint64_t *)&stringPtr);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JL_STATUS_INVALID_SPECIFICATION;
        switch(sVar6) {
        case 1:
          if (stringPtr < (char *)0x100) goto LAB_00104be2;
          break;
        case 2:
          if (stringPtr < (char *)0x10000) goto LAB_00104cd3;
          break;
        default:
          goto switchD_00104a9b_caseD_3;
        case 4:
          if ((ulong)stringPtr >> 0x20 == 0) goto LAB_00104ce7;
          break;
        case 8:
          goto switchD_00104b03_caseD_8;
        }
LAB_00104ced:
        JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
      }
    }
    break;
  case JL_DATA_TYPE_BOOL:
    sVar6 = Description->FieldSize;
    stringPtr = (char *)((ulong)in_RAX & 0xffffffffffffff00);
    JVar2 = JlGetObjectBool(Object,(_Bool *)&stringPtr);
    if (JVar2 == JL_STATUS_SUCCESS) {
      JVar2 = JL_STATUS_INVALID_SPECIFICATION;
      switch(sVar6) {
      case 1:
        *(byte *)Output = (byte)stringPtr;
        break;
      case 2:
        *(ushort *)Output = (ushort)(byte)stringPtr;
        break;
      default:
        goto switchD_00104a9b_caseD_3;
      case 4:
        *(uint *)Output = (uint)(byte)stringPtr;
        break;
      case 8:
        pcVar5 = (char *)((ulong)stringPtr & 0xff);
LAB_00104c6e:
        *(char **)Output = pcVar5;
      }
LAB_00104c72:
      JVar2 = JL_STATUS_SUCCESS;
    }
    break;
  default:
    goto switchD_001049f1_caseD_4;
  case JL_DATA_TYPE_DICTIONARY:
    JVar2 = UnmarshallDictionary
                      (Object,Description->ChildStructDescription,
                       (ulong)Description->ChildStructDescriptionCount,IgnoreExistingValuesInStruct,
                       Output,pErrorAtPos);
  }
switchD_00104a9b_caseD_3:
  if (JVar2 == JL_STATUS_SUCCESS) {
    JVar2 = JL_STATUS_SUCCESS;
  }
  else {
    JVar3 = Description->Type;
switchD_001049f1_caseD_4:
    if ((pErrorAtPos != (size_t *)0x0) && (JVar3 != JL_DATA_TYPE_DICTIONARY)) {
      sVar6 = JlGetObjectTag(Object);
      *pErrorAtPos = sVar6;
    }
  }
  return JVar2;
}

Assistant:

static
JL_STATUS
    UnmarshalObject
    (
        JlDataObject const*         Object,
        JlMarshallElement const*    Description,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if( JL_DATA_TYPE_STRING == Description->Type  &&  0 == Description->FieldSize )
    {
        // Regular allocated string.
        // Output is a pointer to a string.
        jlStatus = UnmarshalString( Object, IgnoreExistingValuesInStruct, Output );
    }
    else if( JL_DATA_TYPE_STRING == Description->Type  &&  Description->FieldSize > 0 )
    {
        // Special case: This is a fixed size string in a structure
        jlStatus = UnmarshalStringFixed( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_UNSIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalUnsigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_SIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalSigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_FLOAT == Description->NumberType )
    {
        jlStatus = UnmarshalFloat( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = UnmarshalBool( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        jlStatus = UnmarshallDictionary(
            Object,
            Description->ChildStructDescription, Description->ChildStructDescriptionCount,
            IgnoreExistingValuesInStruct,
            Output,
            pErrorAtPos );
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    if(     JL_STATUS_SUCCESS != jlStatus
        &&  JL_DATA_TYPE_DICTIONARY != Description->Type
        &&  NULL != pErrorAtPos )
    {
        *pErrorAtPos = JlGetObjectTag( Object );
    }

    return jlStatus;
}